

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void tricore_tr_translate_insn(DisasContextBase_conflict1 *dcbase,CPUState_conflict *cpu)

{
  abi_ptr_conflict addr;
  long lVar1;
  CPUArchState_conflict30 *env;
  TCGContext_conflict9 *pTVar2;
  undefined8 *puVar3;
  long lVar4;
  TCGv_ptr pTVar5;
  DisasJumpType DVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uintptr_t o_3;
  undefined1 *puVar10;
  TCGv_i32 pTVar11;
  TCGv_i64 pTVar12;
  TCGv_i64 pTVar13;
  ulong uVar14;
  TCGv_i32 pTVar15;
  TCGv_i32 pTVar16;
  TCGv_i32 pTVar17;
  ushort uVar18;
  uintptr_t o_18;
  TCGArg TVar19;
  uintptr_t o_20;
  long *plVar20;
  short sVar21;
  uint uVar22;
  uintptr_t o_2;
  TCGTemp *pTVar23;
  int iVar24;
  DisasJumpType DVar25;
  DisasJumpType opc;
  TCGCond TVar26;
  TCGOpcode TVar27;
  code *func;
  DisasContext_conflict14 *ctx;
  TCGContext_conflict9 *pTVar28;
  int32_t iVar29;
  MemOp MVar30;
  byte bVar31;
  uintptr_t o_10;
  uintptr_t o;
  TCGTemp *pTVar32;
  DisasJumpType DVar33;
  uint uVar34;
  uintptr_t o_1;
  TCGTemp *ts;
  TCGContext_conflict9 *tcg_ctx;
  TCGTemp *local_88;
  TCGTemp *local_80;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  lVar1 = *(long *)&dcbase[2].pc_first;
  pTVar28 = *(TCGContext_conflict9 **)(lVar1 + 0x2e8);
  env = (CPUArchState_conflict30 *)cpu->env_ptr;
  local_88 = (TCGTemp *)(ulong)dcbase->pc_next;
  if (*(int *)(lVar1 + 0x57c) == 0) {
    if (*(TCGTemp **)(lVar1 + 0x578 + (long)*(int *)(lVar1 + 0x39e0) * 8) == local_88)
    goto LAB_00d1e2e6;
  }
  else {
    puVar10 = (undefined1 *)g_tree_lookup(*(GTree **)(lVar1 + 0x780),&local_88);
    if (puVar10 == &DAT_00000001) {
LAB_00d1e2e6:
      dcbase->is_jmp = DISAS_TARGET_6;
      return;
    }
  }
  DVar6 = cpu_lduw_code_tricore(env,dcbase->pc_next);
  plVar20 = *(long **)(*(long *)&dcbase[2].pc_first + 0x358);
  if (plVar20 != (long *)0x0) {
    uVar8 = dcbase->pc_next;
LAB_00d1e295:
    lVar1 = plVar20[1];
    if ((*(ulong *)(lVar1 + 0x18) <= *(ulong *)(lVar1 + 0x20) &&
         (*(ulong *)(lVar1 + 0x20) < (ulong)uVar8 || (ulong)uVar8 < *(ulong *)(lVar1 + 0x18))) ||
       (*(char *)(lVar1 + 0x14) == '\x01')) goto LAB_00d1e2c8;
    pTVar2 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
    tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                        (long)(int)uVar8);
    lVar1 = *(long *)&dcbase[2].pc_first;
    uVar8 = dcbase->pc_next;
    pTVar11 = tcg_const_i32_tricore(pTVar28,(DVar6 & DISAS_TOO_MANY) * 2 + 2);
    pTVar12 = tcg_const_i64_tricore(pTVar28,lVar1);
    pTVar13 = tcg_const_i64_tricore(pTVar28,(ulong)uVar8);
    pTVar32 = (TCGTemp *)(pTVar12 + (long)pTVar28);
    ts = (TCGTemp *)(pTVar13 + (long)pTVar28);
    pTVar23 = (TCGTemp *)(pTVar11 + (long)pTVar28);
    local_40 = (TCGTemp *)0x0;
    local_68 = pTVar23;
    local_60 = pTVar32;
    local_58 = pTVar32;
    local_50 = ts;
    local_48 = pTVar23;
    if (*(int *)(lVar1 + 0x4f8) == 1) {
      for (puVar3 = *(undefined8 **)(lVar1 + 0x358); puVar3 != (undefined8 *)0x0;
          puVar3 = (undefined8 *)*puVar3) {
        lVar4 = puVar3[1];
        if (*(char *)(lVar4 + 0x14) == '\0') {
          pTVar12 = tcg_const_i64_tricore(pTVar28,*(int64_t *)(lVar4 + 0x30));
          local_40 = (TCGTemp *)(pTVar12 + (long)pTVar28);
          (**(code **)(lVar1 + 0x178))(lVar1,lVar4,&local_58,4);
          tcg_temp_free_internal_tricore(pTVar28,(TCGTemp *)(pTVar12 + (long)pTVar28));
        }
      }
    }
    else {
      pTVar11 = tcg_const_i32_tricore(pTVar28,2);
      local_88 = pTVar23;
      local_80 = (TCGTemp *)(pTVar11 + (long)pTVar28);
      local_78 = pTVar32;
      local_70 = ts;
      tcg_gen_callN_tricore(pTVar28,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_88);
      tcg_temp_free_internal_tricore(pTVar28,(TCGTemp *)(pTVar11 + (long)pTVar28));
    }
    tcg_temp_free_internal_tricore(pTVar28,ts);
    tcg_temp_free_internal_tricore(pTVar28,local_60);
    tcg_temp_free_internal_tricore(pTVar28,local_68);
    check_exit_request_tricore(pTVar28);
  }
LAB_00d1e483:
  sVar21 = (short)DVar6;
  bVar31 = (byte)(DVar6 >> 8);
  uVar8 = DVar6 >> 8;
  if ((DVar6 & DISAS_TOO_MANY) == DISAS_NEXT) {
    dcbase[1].is_jmp = DVar6 & 0xffff;
    dcbase[1].pc_next = dcbase->pc_next + 2;
    pTVar28 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
    if ((DVar6 & 0x3e) == 0x10) {
switchD_00d1e4de_caseD_10:
      tricore_tr_translate_insn_cold_1();
      goto LAB_00d20741;
    }
    if ((char)DVar6 == -1) goto switchD_00d1e4de_caseD_1;
    DVar25 = DVar6 & 0xfe;
    uVar14 = (ulong)DVar6 & 0xff;
    uVar7 = (uint)uVar14;
    switch(uVar14) {
    case 0:
      decode_sr_system((DisasContext_conflict14 *)dcbase);
      break;
    default:
      goto switchD_00d1e4de_caseD_1;
    case 2:
    case 0x12:
    case 0x1a:
    case 0x22:
    case 0x26:
    case 0x2a:
    case 0x30:
    case 0x3a:
    case 0x40:
    case 0x42:
    case 0x52:
    case 0x5a:
    case 0x60:
    case 0x62:
    case 0x6a:
    case 0x7a:
    case 0x80:
    case 0xa2:
    case 0xa6:
    case 0xc6:
    case 0xe2:
      uVar8 = uVar8 & 0xf;
      uVar22 = DVar6 >> 0xc & 0xf;
      if (0x51 < uVar7) {
        if (uVar7 < 0x7a) {
          if (0x5f < uVar7) {
            if (uVar7 == 0x60) {
              pTVar17 = pTVar28->cpu_gpr_a[uVar8];
LAB_00d1fe06:
              pTVar11 = pTVar28->cpu_gpr_d[uVar22];
              goto LAB_00d1fe10;
            }
            if (uVar7 == 0x62) {
              pTVar5 = pTVar28->cpu_env;
              pTVar11 = pTVar28->cpu_gpr_d[uVar8];
              pTVar17 = pTVar28->cpu_gpr_d[uVar22];
              func = helper_sub_ssov;
LAB_00d1fd99:
              local_78 = (TCGTemp *)((long)&pTVar28->pool_cur + (long)pTVar17);
              local_88 = (TCGTemp *)(pTVar5 + (long)pTVar28);
              local_80 = (TCGTemp *)((long)&pTVar28->pool_cur + (long)pTVar11);
              tcg_gen_callN_tricore(pTVar28,func,local_80,3,&local_88);
              break;
            }
            if (uVar7 == 0x6a) {
              pTVar16 = tcg_const_i32_tricore(pTVar28,0);
              pTVar11 = pTVar28->cpu_gpr_d[uVar8];
              pTVar17 = pTVar28->cpu_gpr_d[0xf];
              pTVar15 = pTVar28->cpu_gpr_d[uVar22];
              TVar26 = TCG_COND_EQ;
              goto LAB_00d1fe63;
            }
            goto switchD_00d1e8e1_caseD_2;
          }
          if (uVar7 == 0x52) {
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
            pTVar11 = pTVar28->cpu_gpr_d[0xf];
          }
          else {
            if (uVar7 != 0x5a) goto switchD_00d1e8e1_caseD_2;
            pTVar17 = pTVar28->cpu_gpr_d[0xf];
            pTVar11 = pTVar28->cpu_gpr_d[uVar8];
          }
          pTVar15 = pTVar28->cpu_gpr_d[uVar22];
        }
        else {
          if (0xa5 < uVar7) {
            if (uVar7 == 0xa6) {
              pTVar11 = (TCGv_i32)((long)&pTVar28->pool_cur + (long)pTVar28->cpu_gpr_d[uVar8]);
              pTVar17 = (TCGv_i32)((long)&pTVar28->pool_cur + (long)pTVar28->cpu_gpr_d[uVar22]);
              TVar27 = INDEX_op_or_i32;
            }
            else {
              if (uVar7 != 0xc6) {
                if (uVar7 == 0xe2) {
                  gen_mul_i32s((DisasContext_conflict14 *)pTVar28,pTVar28->cpu_gpr_d[uVar8],
                               pTVar28->cpu_gpr_d[uVar8],pTVar28->cpu_gpr_d[uVar22]);
                  break;
                }
                goto switchD_00d1e8e1_caseD_2;
              }
              pTVar11 = (TCGv_i32)((long)&pTVar28->pool_cur + (long)pTVar28->cpu_gpr_d[uVar8]);
              pTVar17 = (TCGv_i32)((long)&pTVar28->pool_cur + (long)pTVar28->cpu_gpr_d[uVar22]);
              TVar27 = INDEX_op_xor_i32;
            }
LAB_00d1fdef:
            tcg_gen_op3_tricore(pTVar28,TVar27,(TCGArg)pTVar11,(TCGArg)pTVar11,(TCGArg)pTVar17);
            break;
          }
          if (uVar7 == 0x7a) {
            pTVar11 = pTVar28->cpu_gpr_d[0xf];
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
            pTVar15 = pTVar28->cpu_gpr_d[uVar22];
            TVar26 = TCG_COND_LT;
LAB_00d1fd05:
            tcg_gen_setcond_i32_tricore(pTVar28,TVar26,pTVar11,pTVar17,pTVar15);
            break;
          }
          if (uVar7 == 0x80) {
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
LAB_00d1fdc1:
            pTVar11 = pTVar28->cpu_gpr_a[uVar22];
            goto LAB_00d1fe10;
          }
          if (uVar7 != 0xa2) goto switchD_00d1e8e1_caseD_2;
          pTVar11 = pTVar28->cpu_gpr_d[uVar8];
          pTVar15 = pTVar28->cpu_gpr_d[uVar22];
          pTVar17 = pTVar11;
        }
        gen_sub_d((DisasContext_conflict14 *)pTVar28,pTVar17,pTVar11,pTVar15);
        break;
      }
      if (uVar7 < 0x2a) {
        if (uVar7 < 0x1a) {
          if (uVar7 == 2) {
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
            goto LAB_00d1fe06;
          }
          if (uVar7 == 0x12) {
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
            pTVar11 = pTVar28->cpu_gpr_d[0xf];
            goto LAB_00d1fca6;
          }
        }
        else {
          if (uVar7 == 0x1a) {
            pTVar17 = pTVar28->cpu_gpr_d[0xf];
            pTVar11 = pTVar28->cpu_gpr_d[uVar8];
LAB_00d1fca6:
            pTVar15 = pTVar28->cpu_gpr_d[uVar22];
            goto LAB_00d1fcb3;
          }
          if (uVar7 == 0x22) {
            pTVar5 = pTVar28->cpu_env;
            pTVar11 = pTVar28->cpu_gpr_d[uVar8];
            pTVar17 = pTVar28->cpu_gpr_d[uVar22];
            func = helper_add_ssov;
            goto LAB_00d1fd99;
          }
          if (uVar7 == 0x26) {
            pTVar11 = (TCGv_i32)((long)&pTVar28->pool_cur + (long)pTVar28->cpu_gpr_d[uVar8]);
            pTVar17 = (TCGv_i32)((long)&pTVar28->pool_cur + (long)pTVar28->cpu_gpr_d[uVar22]);
            TVar27 = INDEX_op_and_i32;
            goto LAB_00d1fdef;
          }
        }
      }
      else {
        if (0x39 < uVar7) {
          if (uVar7 == 0x3a) {
            pTVar11 = pTVar28->cpu_gpr_d[0xf];
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
            pTVar15 = pTVar28->cpu_gpr_d[uVar22];
            TVar26 = TCG_COND_EQ;
            goto LAB_00d1fd05;
          }
          if (uVar7 == 0x40) {
            pTVar17 = pTVar28->cpu_gpr_a[uVar8];
            goto LAB_00d1fdc1;
          }
          if (uVar7 != 0x42) goto switchD_00d1e8e1_caseD_2;
          pTVar11 = pTVar28->cpu_gpr_d[uVar8];
          pTVar15 = pTVar28->cpu_gpr_d[uVar22];
          pTVar17 = pTVar11;
LAB_00d1fcb3:
          gen_add_d((DisasContext_conflict14 *)pTVar28,pTVar17,pTVar11,pTVar15);
          break;
        }
        if (uVar7 == 0x2a) {
          pTVar16 = tcg_const_i32_tricore(pTVar28,0);
          pTVar11 = pTVar28->cpu_gpr_d[uVar8];
          pTVar17 = pTVar28->cpu_gpr_d[0xf];
          pTVar15 = pTVar28->cpu_gpr_d[uVar22];
          TVar26 = TCG_COND_NE;
LAB_00d1fe63:
          tcg_gen_movcond_i32_tricore(pTVar28,TVar26,pTVar11,pTVar17,pTVar16,pTVar15,pTVar11);
          pTVar23 = (TCGTemp *)(pTVar16 + (long)pTVar28);
          goto LAB_00d201cf;
        }
        if (uVar7 == 0x30) {
          pTVar11 = (TCGv_i32)((long)&pTVar28->pool_cur + (long)pTVar28->cpu_gpr_a[uVar8]);
          pTVar17 = (TCGv_i32)((long)&pTVar28->pool_cur + (long)pTVar28->cpu_gpr_a[uVar22]);
          TVar27 = INDEX_op_add_i32;
          goto LAB_00d1fdef;
        }
      }
switchD_00d1e8e1_caseD_2:
      pTVar11 = tcg_const_i32_tricore(pTVar28,2);
      pTVar17 = tcg_const_i32_tricore(pTVar28,1);
      pTVar2 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)dcbase->pc_next);
      local_88 = (TCGTemp *)(pTVar28->cpu_env + (long)pTVar28);
      pTVar32 = (TCGTemp *)(pTVar11 + (long)pTVar28);
      pTVar23 = (TCGTemp *)(pTVar17 + (long)pTVar28);
      local_80 = pTVar32;
      local_78 = pTVar23;
      tcg_gen_callN_tricore(pTVar28,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_88);
      dcbase->is_jmp = DISAS_NORETURN;
      goto LAB_00d1ef04;
    case 4:
    case 0x14:
    case 0x44:
    case 0x54:
    case 0x84:
    case 0x94:
    case 0xc4:
    case 0xd4:
      uVar7 = (DVar25 - DISAS_TARGET_1) * 0x10000000 | DVar25 - DISAS_TARGET_1 >> 4;
      if (0xd < uVar7) goto switchD_00d1e8e1_caseD_2;
      uVar8 = uVar8 & 0xf;
      uVar22 = DVar6 >> 0xc & 0xf;
      switch(uVar7) {
      case 0:
        uVar14 = (ulong)uVar22;
        tcg_gen_qemu_ld_i32_tricore
                  (pTVar28,pTVar28->cpu_gpr_d[uVar8],pTVar28->cpu_gpr_a[uVar14],
                   (long)dcbase[1].num_insns,MO_8);
LAB_00d1e907:
        pTVar11 = pTVar28->cpu_gpr_a[uVar14];
        iVar29 = 1;
        break;
      case 1:
        pTVar11 = pTVar28->cpu_gpr_d[uVar8];
        pTVar17 = pTVar28->cpu_gpr_a[uVar22];
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_8;
        goto LAB_00d2045f;
      default:
        goto switchD_00d1e8e1_caseD_2;
      case 4:
        pTVar11 = pTVar28->cpu_gpr_d[uVar8];
        goto LAB_00d2041b;
      case 5:
        pTVar11 = pTVar28->cpu_gpr_d[uVar8];
        goto LAB_00d20447;
      case 8:
        uVar14 = (ulong)uVar22;
        tcg_gen_qemu_ld_i32_tricore
                  (pTVar28,pTVar28->cpu_gpr_d[uVar8],pTVar28->cpu_gpr_a[uVar14],
                   (long)dcbase[1].num_insns,MO_LESW);
LAB_00d20584:
        pTVar11 = pTVar28->cpu_gpr_a[uVar14];
        iVar29 = 2;
        break;
      case 9:
        pTVar11 = pTVar28->cpu_gpr_d[uVar8];
        pTVar17 = pTVar28->cpu_gpr_a[uVar22];
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_LESW;
        goto LAB_00d2045f;
      case 0xc:
        pTVar11 = pTVar28->cpu_gpr_a[uVar8];
LAB_00d2041b:
        uVar14 = (ulong)uVar22;
        tcg_gen_qemu_ld_i32_tricore
                  (pTVar28,pTVar11,pTVar28->cpu_gpr_a[uVar14],(long)dcbase[1].num_insns,MO_LESL);
LAB_00d2051c:
        pTVar11 = pTVar28->cpu_gpr_a[uVar14];
        iVar29 = 4;
        break;
      case 0xd:
        pTVar11 = pTVar28->cpu_gpr_a[uVar8];
LAB_00d20447:
        pTVar17 = pTVar28->cpu_gpr_a[uVar22];
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_LESL;
LAB_00d2045f:
        tcg_gen_qemu_ld_i32_tricore(pTVar28,pTVar11,pTVar17,TVar19,MVar30);
        goto LAB_00d20741;
      }
      tcg_gen_addi_i32_tricore(pTVar28,pTVar11,pTVar11,iVar29);
      break;
    case 6:
    case 0x82:
    case 0x86:
    case 0x8a:
    case 0x92:
    case 0x9a:
    case 0xa0:
    case 0xaa:
    case 0xb0:
    case 0xba:
    case 0xc2:
    case 0xca:
    case 0xd2:
    case 0xea:
    case 0xfa:
      uVar8 = uVar8 & 0xf;
      iVar24 = (int)sVar21 >> 0xc;
      if (uVar7 < 0xaa) {
        if (uVar7 < 0x8a) {
          if (uVar7 == 6) {
            gen_shi((DisasContext_conflict14 *)pTVar28,pTVar28->cpu_gpr_d[uVar8],
                    pTVar28->cpu_gpr_d[uVar8],iVar24);
            break;
          }
          if (uVar7 == 0x82) {
            TVar19 = (TCGArg)iVar24;
            pTVar11 = pTVar28->cpu_gpr_d[uVar8];
LAB_00d1fefd:
            tcg_gen_op2_tricore(pTVar28,INDEX_op_movi_i32,
                                (TCGArg)((long)&pTVar28->pool_cur + (long)pTVar11),TVar19);
            break;
          }
          if (uVar7 == 0x86) {
            gen_shaci((DisasContext_conflict14 *)pTVar28,pTVar28->cpu_gpr_d[uVar8],
                      pTVar28->cpu_gpr_d[uVar8],iVar24);
            break;
          }
        }
        else if (uVar7 < 0x9a) {
          if (uVar7 == 0x8a) {
            pTVar11 = pTVar28->cpu_gpr_d[uVar8];
            pTVar17 = pTVar28->cpu_gpr_d[0xf];
            pTVar15 = tcg_const_i32_tricore(pTVar28,iVar24);
            ctx = *(DisasContext_conflict14 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
            TVar26 = TCG_COND_NE;
            goto LAB_00d1ff73;
          }
          if (uVar7 == 0x92) {
            pTVar11 = pTVar28->cpu_gpr_d[uVar8];
            pTVar17 = pTVar28->cpu_gpr_d[0xf];
            goto LAB_00d1feb9;
          }
        }
        else {
          if (uVar7 == 0x9a) {
            pTVar11 = pTVar28->cpu_gpr_d[0xf];
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
LAB_00d1feb9:
            pTVar15 = tcg_const_i32_tricore(pTVar28,iVar24);
            gen_add_d(*(DisasContext_conflict14 **)(*(long *)&dcbase[2].pc_first + 0x2e8),pTVar11,
                      pTVar17,pTVar15);
            goto LAB_00d1ff84;
          }
          if (uVar7 == 0xa0) {
            TVar19 = (TCGArg)(DVar6 >> 0xc & 0xf);
            pTVar11 = pTVar28->cpu_gpr_a[uVar8];
            goto LAB_00d1fefd;
          }
        }
      }
      else if (uVar7 < 0xca) {
        if (uVar7 < 0xba) {
          if (uVar7 == 0xaa) {
            pTVar15 = tcg_const_i32_tricore(pTVar28,0);
            pTVar16 = tcg_const_i32_tricore(pTVar28,iVar24);
            pTVar11 = pTVar28->cpu_gpr_d[uVar8];
            pTVar17 = pTVar28->cpu_gpr_d[0xf];
            TVar26 = TCG_COND_NE;
LAB_00d1fff4:
            tcg_gen_movcond_i32_tricore(pTVar28,TVar26,pTVar11,pTVar17,pTVar15,pTVar16,pTVar11);
            tcg_temp_free_internal_tricore(pTVar28,(TCGTemp *)(pTVar15 + (long)pTVar28));
            pTVar23 = (TCGTemp *)(pTVar16 + (long)pTVar28);
LAB_00d20010:
            tcg_temp_free_internal_tricore(pTVar28,pTVar23);
            break;
          }
          if (uVar7 == 0xb0) {
            tcg_gen_addi_i32_tricore
                      (pTVar28,pTVar28->cpu_gpr_a[uVar8],pTVar28->cpu_gpr_a[uVar8],iVar24);
            break;
          }
        }
        else {
          if (uVar7 == 0xba) {
            pTVar11 = pTVar28->cpu_gpr_d[0xf];
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
            TVar26 = TCG_COND_EQ;
LAB_00d1ffaf:
            tcg_gen_setcondi_i32_tricore(pTVar28,TVar26,pTVar11,pTVar17,iVar24);
            break;
          }
          if (uVar7 == 0xc2) {
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
            pTVar11 = tcg_const_i32_tricore(pTVar28,iVar24);
            gen_add_d(*(DisasContext_conflict14 **)(*(long *)&dcbase[2].pc_first + 0x2e8),pTVar17,
                      pTVar17,pTVar11);
            goto LAB_00d1f1d9;
          }
        }
      }
      else if (uVar7 < 0xea) {
        if (uVar7 == 0xca) {
          pTVar11 = pTVar28->cpu_gpr_d[uVar8];
          pTVar17 = pTVar28->cpu_gpr_d[0xf];
          pTVar15 = tcg_const_i32_tricore(pTVar28,iVar24);
          ctx = *(DisasContext_conflict14 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
          TVar26 = TCG_COND_EQ;
LAB_00d1ff73:
          gen_cond_add(ctx,TVar26,pTVar11,pTVar15,pTVar11,pTVar17);
LAB_00d1ff84:
          pTVar23 = (TCGTemp *)(pTVar15 + (long)pTVar28);
          goto LAB_00d203ef;
        }
        if (uVar7 == 0xd2) {
          if (((ulong)dcbase[2].tb & 4) != 0) {
            tcg_gen_op2_tricore(pTVar28,INDEX_op_movi_i32,
                                (TCGArg)((long)&pTVar28->pool_cur + (long)pTVar28->cpu_gpr_d[uVar8])
                                ,(long)iVar24);
            tcg_gen_sari_i32_tricore
                      (pTVar28,pTVar28->cpu_gpr_d[(ulong)uVar8 + 1],pTVar28->cpu_gpr_d[uVar8],0x1f);
            break;
          }
          pTVar11 = tcg_const_i32_tricore(pTVar28,2);
          pTVar17 = tcg_const_i32_tricore(pTVar28,1);
          pTVar2 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
          tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                              (long)(int)dcbase->pc_next);
          local_88 = (TCGTemp *)(pTVar28->cpu_env + (long)pTVar28);
          pTVar23 = (TCGTemp *)(pTVar17 + (long)pTVar28);
          local_80 = (TCGTemp *)(pTVar11 + (long)pTVar28);
          local_78 = pTVar23;
          tcg_gen_callN_tricore(pTVar28,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_88);
          dcbase->is_jmp = DISAS_NORETURN;
          tcg_temp_free_internal_tricore(pTVar28,(TCGTemp *)(pTVar11 + (long)pTVar28));
          goto LAB_00d20010;
        }
      }
      else {
        if (uVar7 == 0xea) {
          pTVar15 = tcg_const_i32_tricore(pTVar28,0);
          pTVar16 = tcg_const_i32_tricore(pTVar28,iVar24);
          pTVar11 = pTVar28->cpu_gpr_d[uVar8];
          pTVar17 = pTVar28->cpu_gpr_d[0xf];
          TVar26 = TCG_COND_EQ;
          goto LAB_00d1fff4;
        }
        if (uVar7 == 0xfa) {
          pTVar11 = pTVar28->cpu_gpr_d[0xf];
          pTVar17 = pTVar28->cpu_gpr_d[uVar8];
          TVar26 = TCG_COND_LT;
          goto LAB_00d1ffaf;
        }
      }
      pTVar11 = tcg_const_i32_tricore(pTVar28,2);
      pTVar17 = tcg_const_i32_tricore(pTVar28,1);
      pTVar2 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)dcbase->pc_next);
      local_88 = (TCGTemp *)(pTVar28->cpu_env + (long)pTVar28);
      pTVar23 = (TCGTemp *)(pTVar17 + (long)pTVar28);
      local_80 = (TCGTemp *)(pTVar11 + (long)pTVar28);
      local_78 = pTVar23;
      tcg_gen_callN_tricore(pTVar28,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_88);
      dcbase->is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar28,(TCGTemp *)(pTVar11 + (long)pTVar28));
      goto LAB_00d203ef;
    case 8:
      pTVar11 = *(TCGv_i32 *)((long)pTVar28->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      pTVar17 = pTVar28->cpu_gpr_a[0xf];
      uVar18 = (ushort)((DVar6 & 0xffff) >> 0xc);
      MVar30 = MO_8;
      goto LAB_00d1f873;
    case 0xc:
    case 0x2c:
    case 0x4c:
    case 0x6c:
    case 0x8c:
    case 0xac:
    case 0xcc:
    case 0xec:
      uVar8 = (DVar25 - DISAS_TARGET_9) * 0x8000000 | DVar25 - DISAS_TARGET_9 >> 5;
      if (7 < uVar8) goto switchD_00d1e8e1_caseD_2;
      uVar7 = DVar6 >> 0xc & 0xf;
      uVar22 = DVar6 >> 8 & 0xf;
      switch(uVar8) {
      case 0:
        pTVar11 = pTVar28->cpu_gpr_d[0xf];
        pTVar17 = pTVar28->cpu_gpr_a[uVar7];
        pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
        pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
        tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar17,uVar22);
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_8;
        break;
      case 1:
        pTVar11 = pTVar28->cpu_gpr_d[0xf];
        pTVar17 = pTVar28->cpu_gpr_a[uVar7];
        pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
        pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
        tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar17,uVar22);
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_8;
        goto LAB_00d20387;
      case 2:
        pTVar11 = pTVar28->cpu_gpr_d[0xf];
        goto LAB_00d20395;
      case 3:
        pTVar11 = pTVar28->cpu_gpr_d[0xf];
        goto LAB_00d20271;
      case 4:
        pTVar11 = pTVar28->cpu_gpr_d[0xf];
        pTVar17 = pTVar28->cpu_gpr_a[uVar7];
        pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
        pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
        tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar17,uVar22);
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_LESW;
        break;
      case 5:
        pTVar11 = pTVar28->cpu_gpr_d[0xf];
        pTVar17 = pTVar28->cpu_gpr_a[uVar7];
        pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
        pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
        tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar17,uVar22 * 2);
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_LESW;
        goto LAB_00d20387;
      case 6:
        pTVar11 = pTVar28->cpu_gpr_a[0xf];
LAB_00d20395:
        pTVar17 = pTVar28->cpu_gpr_a[uVar7];
        pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
        pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
        tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar17,uVar22 << 2);
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_LESL;
        break;
      case 7:
        pTVar11 = pTVar28->cpu_gpr_a[0xf];
LAB_00d20271:
        pTVar17 = pTVar28->cpu_gpr_a[uVar7];
        pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
        pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
        tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar17,uVar22 << 2);
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_LESL;
LAB_00d20387:
        tcg_gen_qemu_st_i32_tricore(pTVar28,pTVar11,pTVar15,TVar19,MVar30);
        goto LAB_00d203ef;
      }
      tcg_gen_qemu_ld_i32_tricore(pTVar28,pTVar11,pTVar15,TVar19,MVar30);
      goto LAB_00d203ef;
    case 0xe:
    case 0x3e:
    case 0x4e:
    case 0x76:
    case 0x7c:
    case 0x7e:
    case 0x8e:
    case 0xbc:
    case 0xce:
    case 0xf6:
    case 0xfc:
switchD_00d1e4de_caseD_e:
      uVar7 = DVar6 >> 0xc & 0xf;
      uVar8 = DVar6 >> 8 & 0xf;
      uVar22 = 0;
      goto LAB_00d1f834;
    case 0x10:
      goto switchD_00d1e4de_caseD_10;
    case 0x16:
    case 0x20:
    case 0x58:
    case 0x78:
    case 0x96:
    case 0xd8:
    case 0xda:
    case 0xe0:
    case 0xf8:
      uVar8 = (uint)bVar31;
      if (0x95 < uVar7) {
        if (uVar7 < 0xda) {
          if (uVar7 == 0x96) {
            tcg_gen_ori_i32_tricore(pTVar28,pTVar28->cpu_gpr_d[0xf],pTVar28->cpu_gpr_d[0xf],uVar8);
            break;
          }
          if (uVar7 == 0xd8) {
            pTVar15 = pTVar28->cpu_gpr_a[10];
            pTVar11 = pTVar28->cpu_gpr_a[0xf];
            goto LAB_00d200fe;
          }
        }
        else {
          if (uVar7 == 0xda) {
            pTVar11 = (TCGv_i32)(ulong)uVar8;
            TVar27 = INDEX_op_movi_i32;
            pTVar17 = pTVar28->cpu_gpr_d[0xf] + (long)pTVar28;
            goto LAB_00d2016c;
          }
          if (uVar7 == 0xe0) {
            pTVar11 = tcg_const_i32_tricore(pTVar28,uVar8);
            local_88 = (TCGTemp *)(pTVar28->cpu_env + (long)pTVar28);
            pTVar23 = (TCGTemp *)(pTVar11 + (long)pTVar28);
            local_80 = pTVar23;
            tcg_gen_callN_tricore(pTVar28,helper_bisr,(TCGTemp *)0x0,2,&local_88);
            goto LAB_00d201cf;
          }
          if (uVar7 == 0xf8) {
            pTVar11 = pTVar28->cpu_gpr_a[10];
            pTVar17 = pTVar28->cpu_gpr_a[0xf];
            goto LAB_00d1ee03;
          }
        }
        goto switchD_00d1e8e1_caseD_2;
      }
      if (uVar7 < 0x58) {
        if (uVar7 == 0x16) {
          tcg_gen_andi_i32_tricore(pTVar28,pTVar28->cpu_gpr_d[0xf],pTVar28->cpu_gpr_d[0xf],uVar8);
          break;
        }
        if (uVar7 == 0x20) {
          tcg_gen_subi_i32_tricore(pTVar28,pTVar28->cpu_gpr_a[10],pTVar28->cpu_gpr_a[10],uVar8);
          break;
        }
        goto switchD_00d1e8e1_caseD_2;
      }
      if (uVar7 != 0x58) {
        if (uVar7 == 0x78) {
          pTVar11 = pTVar28->cpu_gpr_a[10];
          pTVar17 = pTVar28->cpu_gpr_d[0xf];
LAB_00d1ee03:
          pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
          tcg_gen_addi_i32_tricore
                    (pTVar28,(TCGv_i32)((long)pTVar23 - (long)pTVar28),pTVar11,uVar8 << 2);
          tcg_gen_qemu_st_i32_tricore
                    (pTVar28,pTVar17,(TCGv_i32)((long)pTVar23 - (long)pTVar28),
                     (long)dcbase[1].num_insns,MO_LESL);
          goto LAB_00d201cf;
        }
        goto switchD_00d1e8e1_caseD_2;
      }
      pTVar15 = pTVar28->cpu_gpr_a[10];
      pTVar11 = pTVar28->cpu_gpr_d[0xf];
LAB_00d200fe:
      pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
      pTVar17 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
      tcg_gen_addi_i32_tricore(pTVar28,pTVar17,pTVar15,uVar8 << 2);
      iVar24 = dcbase[1].num_insns;
      MVar30 = MO_LESL;
LAB_00d20146:
      tcg_gen_qemu_ld_i32_tricore(pTVar28,pTVar11,pTVar17,(long)iVar24,MVar30);
      goto LAB_00d201cf;
    case 0x1e:
    case 0x5e:
switchD_00d1e4de_caseD_1e:
      uVar8 = uVar8 & 0xf;
      uVar22 = (int)sVar21 >> 0xc;
      uVar7 = 0;
      goto LAB_00d1f834;
    case 0x24:
    case 0x34:
    case 100:
    case 0x74:
    case 0xa4:
    case 0xb4:
    case 0xe4:
    case 0xf4:
      uVar7 = (DVar25 - 0x24) * 0x10000000 | DVar25 - 0x24 >> 4;
      if (0xd < uVar7) goto switchD_00d1e8e1_caseD_2;
      uVar8 = uVar8 & 0xf;
      uVar22 = DVar6 >> 0xc & 0xf;
      switch(uVar7) {
      case 0:
        uVar14 = (ulong)uVar22;
        tcg_gen_qemu_st_i32_tricore
                  (pTVar28,pTVar28->cpu_gpr_d[uVar8],pTVar28->cpu_gpr_a[uVar14],
                   (long)dcbase[1].num_insns,MO_8);
        goto LAB_00d1e907;
      case 1:
        pTVar11 = pTVar28->cpu_gpr_d[uVar8];
        pTVar17 = pTVar28->cpu_gpr_a[uVar22];
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_8;
        break;
      default:
        goto switchD_00d1e8e1_caseD_2;
      case 4:
        pTVar11 = pTVar28->cpu_gpr_d[uVar8];
        goto LAB_00d204ff;
      case 5:
        pTVar11 = pTVar28->cpu_gpr_d[uVar8];
        goto LAB_00d2053b;
      case 8:
        uVar14 = (ulong)uVar22;
        tcg_gen_qemu_st_i32_tricore
                  (pTVar28,pTVar28->cpu_gpr_d[uVar8],pTVar28->cpu_gpr_a[uVar14],
                   (long)dcbase[1].num_insns,MO_16);
        goto LAB_00d20584;
      case 9:
        pTVar11 = pTVar28->cpu_gpr_d[uVar8];
        pTVar17 = pTVar28->cpu_gpr_a[uVar22];
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_16;
        break;
      case 0xc:
        pTVar11 = pTVar28->cpu_gpr_a[uVar8];
LAB_00d204ff:
        uVar14 = (ulong)uVar22;
        tcg_gen_qemu_st_i32_tricore
                  (pTVar28,pTVar11,pTVar28->cpu_gpr_a[uVar14],(long)dcbase[1].num_insns,MO_32);
        goto LAB_00d2051c;
      case 0xd:
        pTVar11 = pTVar28->cpu_gpr_a[uVar8];
LAB_00d2053b:
        pTVar17 = pTVar28->cpu_gpr_a[uVar22];
        TVar19 = (TCGArg)dcbase[1].num_insns;
        MVar30 = MO_32;
      }
      tcg_gen_qemu_st_i32_tricore(pTVar28,pTVar11,pTVar17,TVar19,MVar30);
      break;
    case 0x28:
      pTVar11 = *(TCGv_i32 *)((long)pTVar28->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      pTVar17 = pTVar28->cpu_gpr_a[0xf];
      uVar18 = (ushort)(((ulong)DVar6 & 0xffff) >> 0xc);
      MVar30 = MO_8;
      goto LAB_00d1f8a5;
    case 0x2e:
    case 0xae:
      uVar8 = uVar8 & 0xf;
      uVar22 = DVar6 >> 0xc & 0xf;
      uVar7 = 0;
      goto LAB_00d1f834;
    case 0x32:
      decode_sr_accu((DisasContext_conflict14 *)dcbase);
      break;
    case 0x3c:
    case 0x5c:
    case 0x6e:
    case 0xee:
      uVar8 = (uint)(char)bVar31;
      uVar7 = 0;
      uVar22 = 0;
      goto LAB_00d1f834;
    case 0x46:
      pTVar11 = (TCGv_i32)
                ((long)&pTVar28->pool_cur +
                *(long *)((long)pTVar28->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78)));
      TVar27 = INDEX_op_not_i32;
      pTVar17 = pTVar11;
LAB_00d2016c:
      tcg_gen_op2_tricore(pTVar28,TVar27,(TCGArg)pTVar17,(TCGArg)pTVar11);
      break;
    case 0x48:
      pTVar11 = *(TCGv_i32 *)((long)pTVar28->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      goto LAB_00d1f85b;
    case 0x68:
      pTVar11 = *(TCGv_i32 *)((long)pTVar28->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      goto LAB_00d1f7cd;
    case 0x88:
      pTVar11 = *(TCGv_i32 *)((long)pTVar28->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      pTVar17 = pTVar28->cpu_gpr_a[0xf];
      uVar18 = (ushort)(DVar6 >> 0xb) & 0x1e;
      MVar30 = MO_LESW;
      goto LAB_00d1f873;
    case 0x9e:
    case 0xde:
      if (((ulong)dcbase[2].tb & 4) != 0) goto switchD_00d1e4de_caseD_1e;
      goto switchD_00d1e4de_caseD_1;
    case 0xa8:
      pTVar11 = *(TCGv_i32 *)((long)pTVar28->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      pTVar17 = pTVar28->cpu_gpr_a[0xf];
      uVar18 = (ushort)(DVar6 >> 0xb) & 0x1e;
      MVar30 = MO_LESW;
      goto LAB_00d1f8a5;
    case 0xbe:
    case 0xfe:
      if (((ulong)dcbase[2].tb & 4) != 0) goto switchD_00d1e4de_caseD_e;
switchD_00d1e4de_caseD_1:
      generate_trap((DisasContext_conflict14 *)dcbase,2,1);
      break;
    case 200:
      pTVar11 = *(TCGv_i32 *)((long)pTVar28->cpu_gpr_a + (ulong)(DVar6 >> 5 & 0x78));
LAB_00d1f85b:
      pTVar17 = pTVar28->cpu_gpr_a[0xf];
      uVar18 = (ushort)(DVar6 >> 10) & 0x3c;
      MVar30 = MO_LESL;
LAB_00d1f873:
      gen_offset_ld((DisasContext_conflict14 *)dcbase,pTVar11,pTVar17,uVar18,MVar30);
      break;
    case 0xdc:
      uVar7 = DVar6 >> 8 & 0xf;
      DVar25 = 0xdc;
      uVar22 = 0;
      uVar8 = 0;
LAB_00d1f834:
      gen_compute_branch((DisasContext_conflict14 *)dcbase,DVar25,uVar7,0,uVar22,uVar8);
      break;
    case 0xe8:
      pTVar11 = *(TCGv_i32 *)((long)pTVar28->cpu_gpr_a + (ulong)(DVar6 >> 5 & 0x78));
LAB_00d1f7cd:
      pTVar17 = pTVar28->cpu_gpr_a[0xf];
      uVar18 = (ushort)(DVar6 >> 10) & 0x3c;
      MVar30 = MO_LESL;
LAB_00d1f8a5:
      gen_offset_st((DisasContext_conflict14 *)dcbase,pTVar11,pTVar17,uVar18,MVar30);
    }
    goto LAB_00d20741;
  }
  uVar9 = cpu_lduw_code_tricore(env,dcbase->pc_next + 2);
  DVar25 = uVar9 << 0x10;
  DVar33 = DVar6 & 0xffff | DVar25;
  dcbase[1].is_jmp = DVar33;
  dcbase[1].pc_next = dcbase->pc_next + 4;
  if ((DVar6 & 0x7f) == 0x6f) {
    opc = 0x6f;
  }
  else {
    opc = DVar6 & 0xff;
  }
  uVar7 = opc - DISAS_TOO_MANY >> 1 | (uint)((opc - DISAS_TOO_MANY & 1) != 0) << 0x1f;
  if (0x7f < uVar7) {
switchD_00d1e5b5_caseD_10:
    generate_trap((DisasContext_conflict14 *)dcbase,2,1);
    goto LAB_00d20741;
  }
  pTVar28 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
  switch(uVar7) {
  case 0:
    decode_rr_address((DisasContext_conflict14 *)dcbase);
    break;
  case 1:
    decode_rrr2_madd((DisasContext_conflict14 *)dcbase);
    break;
  case 2:
    decode_abs_ldb((DisasContext_conflict14 *)dcbase);
    break;
  case 3:
    decode_bit_logical_t2((DisasContext_conflict14 *)dcbase);
    break;
  case 4:
    decode_bo_addrmode_ld_post_pre_base((DisasContext_conflict14 *)dcbase);
    break;
  case 5:
    decode_rr_accumulator((DisasContext_conflict14 *)dcbase);
    break;
  case 6:
    decode_sys_interrupts((DisasContext_conflict14 *)dcbase);
    break;
  case 7:
    decode_rr_logical_shift((DisasContext_conflict14 *)dcbase);
    break;
  case 8:
  case 0xd:
  case 0x1d:
  case 0x26:
  case 0x3d:
  case 0x48:
  case 0x4d:
  case 0x5d:
  case 0x66:
  case 0x7d:
    decode_rlc_opc((DisasContext_conflict14 *)dcbase,opc);
    break;
  case 9:
    decode_rcr_madd((DisasContext_conflict14 *)dcbase);
    break;
  case 10:
    decode_abs_ldst_context((DisasContext_conflict14 *)dcbase);
    break;
  case 0xb:
    decode_rrrr_extract_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0xc:
  case 0x1c:
  case 0x2c:
  case 0x3c:
  case 0x4c:
  case 0x5a:
  case 0x5c:
  case 100:
  case 0x6c:
  case 0x74:
  case 0x7c:
    uVar8 = uVar8 & 0xf;
    uVar7 = DVar6 >> 0xc & 0xf;
    uVar22 = (int)(uVar9 << 0x14) >> 0x10 & 0xfffffc00U | DVar25 >> 0x16 & 0xffffffc0 | uVar9 & 0x3f
    ;
    if (0xb4 < opc) {
      if (opc < 0xd9) {
        if (opc == 0xb5) {
          if (((ulong)dcbase[2].tb & 4) != 0) {
            pTVar17 = pTVar28->cpu_gpr_a[uVar8];
            pTVar11 = pTVar28->cpu_gpr_a[uVar7];
            pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
            pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
            tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar11,uVar22);
            TVar19 = (TCGArg)dcbase[1].num_insns;
            MVar30 = MO_32;
            goto LAB_00d206e9;
          }
          goto LAB_00d1faf7;
        }
        if (opc == 0xb9) {
          if (((ulong)dcbase[2].tb & 4) == 0) goto LAB_00d1faf7;
          pTVar11 = pTVar28->cpu_gpr_d[uVar8];
          pTVar17 = pTVar28->cpu_gpr_a[uVar7];
          pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
          pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
          tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar17,uVar22);
          TVar19 = (TCGArg)dcbase[1].num_insns;
          MVar30 = MO_16;
        }
        else {
          if (opc != 0xc9) goto LAB_00d1fbb3;
          if (((ulong)dcbase[2].tb & 4) == 0) goto LAB_00d1faf7;
          pTVar11 = pTVar28->cpu_gpr_d[uVar8];
          pTVar17 = pTVar28->cpu_gpr_a[uVar7];
          pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
          pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
          tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar17,uVar22);
          TVar19 = (TCGArg)dcbase[1].num_insns;
          MVar30 = MO_LESW;
        }
LAB_00d1fa10:
        tcg_gen_qemu_ld_i32_tricore(pTVar28,pTVar11,pTVar15,TVar19,MVar30);
      }
      else {
        if (opc == 0xd9) {
          tcg_gen_addi_i32_tricore
                    (pTVar28,pTVar28->cpu_gpr_a[uVar8],pTVar28->cpu_gpr_a[uVar7],uVar22);
          break;
        }
        if (opc == 0xe9) {
          if (((ulong)dcbase[2].tb & 4) != 0) {
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
            pTVar11 = pTVar28->cpu_gpr_a[uVar7];
            pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
            pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
            tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar11,uVar22);
            TVar19 = (TCGArg)dcbase[1].num_insns;
            MVar30 = MO_ASHIFT;
LAB_00d206e9:
            tcg_gen_qemu_st_i32_tricore(pTVar28,pTVar17,pTVar15,TVar19,MVar30);
            goto LAB_00d206f4;
          }
        }
        else {
          if (opc != 0xf9) goto LAB_00d1fbb3;
          if (((ulong)dcbase[2].tb & 4) != 0) {
            pTVar17 = pTVar28->cpu_gpr_d[uVar8];
            pTVar11 = pTVar28->cpu_gpr_a[uVar7];
            pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
            pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
            tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar11,uVar22);
            TVar19 = (TCGArg)dcbase[1].num_insns;
            MVar30 = MO_LESW;
            goto LAB_00d206e9;
          }
        }
LAB_00d1faf7:
        pTVar11 = tcg_const_i32_tricore(pTVar28,2);
        pTVar17 = tcg_const_i32_tricore(pTVar28,1);
        pTVar2 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
        tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                            (long)(int)dcbase->pc_next);
        local_88 = (TCGTemp *)(pTVar28->cpu_env + (long)pTVar28);
        pTVar23 = (TCGTemp *)(pTVar17 + (long)pTVar28);
        local_80 = (TCGTemp *)(pTVar11 + (long)pTVar28);
        local_78 = pTVar23;
        tcg_gen_callN_tricore(pTVar28,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_88);
        dcbase->is_jmp = DISAS_NORETURN;
        tcg_temp_free_internal_tricore(pTVar28,(TCGTemp *)(pTVar11 + (long)pTVar28));
      }
LAB_00d206f4:
      tcg_temp_free_internal_tricore(pTVar28,pTVar23);
      break;
    }
    if (opc < 0x59) {
      if (opc != 0x19) {
        if (opc == 0x39) {
          if (((ulong)dcbase[2].tb & 4) != 0) {
            pTVar11 = pTVar28->cpu_gpr_d[uVar8];
            pTVar17 = pTVar28->cpu_gpr_a[uVar7];
            pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
            pTVar15 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
            tcg_gen_addi_i32_tricore(pTVar28,pTVar15,pTVar17,uVar22);
            TVar19 = (TCGArg)dcbase[1].num_insns;
            MVar30 = MO_8;
            goto LAB_00d1fa10;
          }
          goto LAB_00d1faf7;
        }
        goto LAB_00d1fbb3;
      }
      pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
      tcg_gen_addi_i32_tricore
                (pTVar28,(TCGv_i32)((long)pTVar23 - (long)pTVar28),pTVar28->cpu_gpr_a[uVar7],uVar22)
      ;
      tcg_gen_qemu_ld_i32_tricore
                (pTVar28,pTVar28->cpu_gpr_d[uVar8],(TCGv_i32)((long)pTVar23 - (long)pTVar28),
                 (long)dcbase[1].num_insns,MO_32);
      goto LAB_00d203ef;
    }
    if (opc == 0x59) {
      pTVar11 = pTVar28->cpu_gpr_d[uVar8];
      pTVar17 = pTVar28->cpu_gpr_a[uVar7];
      pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
      tcg_gen_addi_i32_tricore(pTVar28,(TCGv_i32)((long)pTVar23 - (long)pTVar28),pTVar17,uVar22);
      tcg_gen_qemu_st_i32_tricore
                (pTVar28,pTVar11,(TCGv_i32)((long)pTVar23 - (long)pTVar28),(long)dcbase[1].num_insns
                 ,MO_32);
      goto LAB_00d203ef;
    }
    if (opc == 0x79) {
      if (((ulong)dcbase[2].tb & 4) == 0) {
        pTVar11 = tcg_const_i32_tricore(pTVar28,2);
        pTVar17 = tcg_const_i32_tricore(pTVar28,1);
        pTVar2 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
        tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                            (long)(int)dcbase->pc_next);
        local_88 = (TCGTemp *)(pTVar28->cpu_env + (long)pTVar28);
        pTVar23 = (TCGTemp *)(pTVar17 + (long)pTVar28);
        local_80 = (TCGTemp *)(pTVar11 + (long)pTVar28);
        local_78 = pTVar23;
        tcg_gen_callN_tricore(pTVar28,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_88);
        dcbase->is_jmp = DISAS_NORETURN;
        tcg_temp_free_internal_tricore(pTVar28,(TCGTemp *)(pTVar11 + (long)pTVar28));
      }
      else {
        pTVar11 = pTVar28->cpu_gpr_d[uVar8];
        pTVar17 = pTVar28->cpu_gpr_a[uVar7];
        pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
        tcg_gen_addi_i32_tricore(pTVar28,(TCGv_i32)((long)pTVar23 - (long)pTVar28),pTVar17,uVar22);
        tcg_gen_qemu_ld_i32_tricore
                  (pTVar28,pTVar11,(TCGv_i32)((long)pTVar23 - (long)pTVar28),
                   (long)dcbase[1].num_insns,MO_ASHIFT);
      }
      tcg_temp_free_internal_tricore(pTVar28,pTVar23);
      break;
    }
    if (opc == 0x99) {
      pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
      pTVar17 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
      tcg_gen_addi_i32_tricore(pTVar28,pTVar17,pTVar28->cpu_gpr_a[uVar7],uVar22);
      pTVar11 = pTVar28->cpu_gpr_a[uVar8];
      iVar24 = dcbase[1].num_insns;
      MVar30 = MO_32;
      goto LAB_00d20146;
    }
LAB_00d1fbb3:
    pTVar11 = tcg_const_i32_tricore(pTVar28,2);
    pTVar17 = tcg_const_i32_tricore(pTVar28,1);
    pTVar2 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
    tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                        (long)(int)dcbase->pc_next);
    local_88 = (TCGTemp *)(pTVar28->cpu_env + (long)pTVar28);
    pTVar32 = (TCGTemp *)(pTVar11 + (long)pTVar28);
    pTVar23 = (TCGTemp *)(pTVar17 + (long)pTVar28);
    local_80 = pTVar32;
    local_78 = pTVar23;
    tcg_gen_callN_tricore(pTVar28,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_88);
    dcbase->is_jmp = DISAS_NORETURN;
LAB_00d1ef04:
    tcg_temp_free_internal_tricore(pTVar28,pTVar32);
LAB_00d201cf:
    tcg_temp_free_internal_tricore(pTVar28,pTVar23);
    break;
  case 0xe:
  case 0x2e:
  case 0x30:
  case 0x36:
  case 0x4e:
  case 0x6e:
  case 0x70:
  case 0x76:
    uVar22 = ((int)sVar21 & 0xffff00U) << 8 | uVar9 & 0xffff;
    uVar7 = 0;
    uVar8 = 0;
    iVar29 = 0;
    goto LAB_00d1eabc;
  case 0xf:
  case 0x1f:
  case 0x2f:
  case 0x3e:
  case 0x3f:
  case 0x5e:
  case 0x7e:
    uVar8 = DVar6 >> 0xc & 0xf;
    goto LAB_00d1e938;
  default:
    goto switchD_00d1e5b5_caseD_10;
  case 0x11:
    decode_rrr2_msub((DisasContext_conflict14 *)dcbase);
    break;
  case 0x12:
    decode_abs_storeb_h((DisasContext_conflict14 *)dcbase);
    break;
  case 0x13:
    decode_bit_sh_logic1((DisasContext_conflict14 *)dcbase);
    break;
  case 0x14:
    decode_bo_addrmode_ld_bitreverse_circular((DisasContext_conflict14 *)dcbase);
    break;
  case 0x15:
    decode_rrr_cond_select((DisasContext_conflict14 *)dcbase);
    break;
  case 0x16:
    decode_rr_idirect((DisasContext_conflict14 *)dcbase);
    break;
  case 0x17:
    tcg_gen_op2_tricore(pTVar28,INDEX_op_movi_i32,(TCGArg)(pTVar28->cpu_PSW_V + (long)pTVar28),0);
    pTVar11 = pTVar28->cpu_PSW_SV;
    if (pTVar11 != pTVar28->cpu_PSW_V) {
      tcg_gen_op2_tricore(pTVar28,INDEX_op_mov_i32,(TCGArg)(pTVar11 + (long)pTVar28),
                          (TCGArg)(pTVar28->cpu_PSW_V + (long)pTVar28));
      pTVar11 = pTVar28->cpu_PSW_V;
    }
    if (pTVar28->cpu_PSW_AV != pTVar11) {
      tcg_gen_op2_tricore(pTVar28,INDEX_op_mov_i32,(TCGArg)(pTVar28->cpu_PSW_AV + (long)pTVar28),
                          (TCGArg)(pTVar11 + (long)pTVar28));
      pTVar11 = pTVar28->cpu_PSW_V;
    }
    pTVar17 = pTVar28->cpu_PSW_SAV;
LAB_00d1fe10:
    if (pTVar17 == pTVar11) break;
    pTVar11 = pTVar11 + (long)pTVar28;
    TVar27 = INDEX_op_mov_i32;
    pTVar17 = pTVar17 + (long)pTVar28;
    goto LAB_00d2016c;
  case 0x19:
    decode_rcr_msub((DisasContext_conflict14 *)dcbase);
    break;
  case 0x1b:
    decode_rrpw_extract_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0x21:
    decode_rrr1_maddq_h((DisasContext_conflict14 *)dcbase);
    break;
  case 0x22:
    pTVar17 = tcg_const_i32_tricore
                        (pTVar28,(DVar6 & 0xf000) << 0x10 | uVar9 & 0x3f |
                                 DVar25 >> 0x16 & 0xffffffc0 | DVar25 >> 0xc & 0x3c00);
    uVar14 = (ulong)(DVar6 >> 5 & 0x78);
    tcg_gen_qemu_ld_i32_tricore
              (pTVar28,*(TCGv_i32 *)((long)pTVar28->cpu_gpr_d + uVar14),pTVar17,
               (long)dcbase[1].num_insns,MO_16);
    pTVar11 = *(TCGv_i32 *)((long)pTVar28->cpu_gpr_d + uVar14);
    tcg_gen_shli_i32_tricore(pTVar28,pTVar11,pTVar11,0x10);
    pTVar23 = (TCGTemp *)(pTVar17 + (long)pTVar28);
    goto LAB_00d203ef;
  case 0x23:
    decode_bit_andacc((DisasContext_conflict14 *)dcbase);
    break;
  case 0x24:
    decode_bo_addrmode_stctx_post_pre_base((DisasContext_conflict14 *)dcbase);
    break;
  case 0x25:
    decode_rr_divide((DisasContext_conflict14 *)dcbase);
    break;
  case 0x29:
    decode_rc_mul((DisasContext_conflict14 *)dcbase);
    break;
  case 0x2b:
    decode_rrrw_extract_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0x31:
    decode_rrr1_msubq_h((DisasContext_conflict14 *)dcbase);
    break;
  case 0x32:
    pTVar11 = tcg_const_i32_tricore
                        (pTVar28,(DVar6 & 0xf000) << 0x10 | uVar9 & 0x3f |
                                 DVar25 >> 0x16 & 0xffffffc0 | DVar25 >> 0xc & 0x3c00);
    pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
    tcg_gen_shri_i32_tricore
              (pTVar28,(TCGv_i32)((long)pTVar23 - (long)pTVar28),
               *(TCGv_i32 *)((long)pTVar28->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78)),0x10);
    tcg_gen_qemu_st_i32_tricore
              (pTVar28,(TCGv_i32)((long)pTVar23 - (long)pTVar28),pTVar11,(long)dcbase[1].num_insns,
               MO_16);
    tcg_temp_free_internal_tricore(pTVar28,pTVar23);
LAB_00d1f1d9:
    pTVar23 = (TCGTemp *)(pTVar11 + (long)pTVar28);
    goto LAB_00d203ef;
  case 0x33:
    decode_bit_insert((DisasContext_conflict14 *)(ulong)DVar33);
    break;
  case 0x34:
    decode_bo_addrmode_ldmst_bitreverse_circular((DisasContext_conflict14 *)dcbase);
    break;
  case 0x35:
    decode_rrr_divide((DisasContext_conflict14 *)dcbase);
    break;
  case 0x37:
    uVar8 = 0;
LAB_00d1e938:
    iVar29 = 0;
LAB_00d1eab9:
    uVar7 = DVar6 >> 8 & 0xf;
    uVar22 = (int)(uVar9 << 0x11) >> 0x11;
LAB_00d1eabc:
    gen_compute_branch((DisasContext_conflict14 *)dcbase,opc,uVar7,uVar8,iVar29,uVar22);
    break;
  case 0x39:
    decode_rr2_mul((DisasContext_conflict14 *)dcbase);
    break;
  case 0x3b:
    uVar8 = DVar6 >> 8 & 0xf;
    uVar34 = DVar6 >> 0xc & 0xf;
    uVar7 = DVar25 >> 0x1c;
    uVar22 = DVar25 >> 0x17 & 0x1f;
    if (uVar8 == uVar34) {
      tcg_gen_rotli_i32_tricore(pTVar28,pTVar28->cpu_gpr_d[uVar7],pTVar28->cpu_gpr_d[uVar8],uVar22);
      break;
    }
    pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
    tcg_gen_shli_i32_tricore
              (pTVar28,(TCGv_i32)((long)pTVar23 - (long)pTVar28),pTVar28->cpu_gpr_d[uVar8],uVar22);
    tcg_gen_shri_i32_tricore
              (pTVar28,pTVar28->cpu_gpr_d[uVar7],pTVar28->cpu_gpr_d[uVar34],0x20 - uVar22);
    pTVar11 = (TCGv_i32)((long)&pTVar28->pool_cur + (long)pTVar28->cpu_gpr_d[uVar7]);
    tcg_gen_op3_tricore(pTVar28,INDEX_op_or_i32,(TCGArg)pTVar11,(TCGArg)pTVar11,(TCGArg)pTVar23);
    goto LAB_00d203ef;
  case 0x41:
    decode_rrr1_madd((DisasContext_conflict14 *)dcbase);
    break;
  case 0x42:
    decode_abs_ldw((DisasContext_conflict14 *)dcbase);
    break;
  case 0x43:
    decode_bit_logical_t((DisasContext_conflict14 *)dcbase);
    break;
  case 0x44:
    decode_bo_addrmode_post_pre_base((DisasContext_conflict14 *)dcbase);
    break;
  case 0x45:
    decode_rc_accumulator((DisasContext_conflict14 *)dcbase);
    break;
  case 0x47:
    decode_rc_logical_shift((DisasContext_conflict14 *)dcbase);
    break;
  case 0x49:
    decode_rr1_mulq((DisasContext_conflict14 *)dcbase);
    break;
  case 0x4b:
    local_68 = (TCGTemp *)tcg_const_i32_tricore(pTVar28,DVar6 >> 0xc & 0xf);
    pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
    pTVar17 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
    pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
    pTVar11 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
    if ((uVar9 >> 0xc & 1) != 0) {
      generate_trap((DisasContext_conflict14 *)dcbase,2,3);
    }
    tcg_gen_andi_i32_tricore(pTVar28,pTVar17,pTVar28->cpu_gpr_d[(ulong)(DVar25 >> 0x1c) + 1],0x1f);
    tcg_gen_andi_i32_tricore(pTVar28,pTVar11,pTVar28->cpu_gpr_d[DVar25 >> 0x1c],0x1f);
    pTVar23 = local_68;
    gen_insert(*(DisasContext_conflict14 **)(*(long *)&dcbase[2].pc_first + 0x2e8),
               pTVar28->cpu_gpr_d[DVar25 >> 0x18 & 0xf],pTVar28->cpu_gpr_d[(ulong)uVar8 & 0xf],
               (TCGv_i32)local_68,pTVar17,pTVar11);
    tcg_temp_free_internal_tricore
              (pTVar28,(TCGTemp *)((long)&pTVar28->pool_cur + (long)&pTVar23->field_0x0));
    tcg_temp_free_internal_tricore(pTVar28,(TCGTemp *)(pTVar17 + (long)pTVar28));
    pTVar23 = (TCGTemp *)(pTVar11 + (long)pTVar28);
    goto LAB_00d203ef;
  case 0x4f:
  case 0x5f:
  case 0x6f:
  case 0x7f:
    iVar29 = (int)sVar21 >> 0xc;
    uVar8 = 0;
    goto LAB_00d1eab9;
  case 0x51:
    decode_rrr1_msub((DisasContext_conflict14 *)dcbase);
    break;
  case 0x52:
    decode_abs_store((DisasContext_conflict14 *)dcbase);
    break;
  case 0x53:
    decode_bit_sh_logic2((DisasContext_conflict14 *)dcbase);
    break;
  case 0x54:
    decode_bo_addrmode_bitreverse_circular((DisasContext_conflict14 *)dcbase);
    break;
  case 0x55:
    decode_rcr_cond_select((DisasContext_conflict14 *)dcbase);
    break;
  case 0x56:
    decode_rc_serviceroutine((DisasContext_conflict14 *)dcbase);
    break;
  case 0x59:
    decode_rr1_mul((DisasContext_conflict14 *)dcbase);
    break;
  case 0x5b:
    decode_rcpw_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0x61:
    decode_rrr1_maddsu_h((DisasContext_conflict14 *)dcbase);
    break;
  case 0x62:
    tcg_gen_op2_tricore(pTVar28,INDEX_op_movi_i32,
                        (long)&pTVar28->pool_cur +
                        *(long *)((long)pTVar28->cpu_gpr_a + (ulong)(DVar6 >> 5 & 0x78)),
                        (long)(int)((DVar6 & 0xf000) << 0x10 | uVar9 & 0x3f |
                                    DVar25 >> 0x16 & 0xffffffc0 | DVar25 >> 0xc & 0x3c00));
    break;
  case 99:
    decode_bit_orand((DisasContext_conflict14 *)dcbase);
    break;
  case 0x6a:
    pTVar11 = tcg_const_i32_tricore
                        (pTVar28,(DVar6 & 0xf000) << 0x10 | uVar9 & 0x3f |
                                 DVar25 >> 0x16 & 0xffffffc0 | DVar25 >> 0xc & 0x3c00);
    pTVar23 = tcg_temp_new_internal_tricore(pTVar28,TCG_TYPE_I32,false);
    pTVar17 = (TCGv_i32)((long)pTVar23 - (long)pTVar28);
    tcg_gen_qemu_ld_i32_tricore(pTVar28,pTVar17,pTVar11,(long)dcbase[1].num_insns,MO_8);
    bVar31 = bVar31 & 7;
    tcg_gen_andi_i32_tricore(pTVar28,pTVar17,pTVar17,-2 << bVar31 | 0xfffffffeU >> 0x20 - bVar31);
    tcg_gen_ori_i32_tricore(pTVar28,pTVar17,pTVar17,(DVar6 >> 0xb & 1) << bVar31);
    tcg_gen_qemu_st_i32_tricore(pTVar28,pTVar17,pTVar11,(long)dcbase[1].num_insns,MO_8);
    tcg_temp_free_internal_tricore(pTVar28,(TCGTemp *)(pTVar11 + (long)pTVar28));
LAB_00d203ef:
    tcg_temp_free_internal_tricore(pTVar28,pTVar23);
    break;
  case 0x6b:
    decode_rcrw_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0x71:
    decode_rrr1_msubad_h((DisasContext_conflict14 *)dcbase);
    break;
  case 0x72:
    decode_abs_ldst_swap((DisasContext_conflict14 *)dcbase);
  }
LAB_00d20741:
  addr = dcbase[1].pc_next;
  dcbase->pc_next = addr;
  if ((dcbase->is_jmp == DISAS_NEXT) &&
     ((uVar8 = addr - (dcbase->pc_first & 0xffffc000), 0x3fff < uVar8 ||
      ((0x3ffc < uVar8 && (uVar9 = cpu_lduw_code_tricore(env,addr), (uVar9 & 1) != 0)))))) {
    dcbase->is_jmp = DISAS_TOO_MANY;
  }
  return;
LAB_00d1e2c8:
  plVar20 = (long *)*plVar20;
  if (plVar20 == (long *)0x0) goto LAB_00d1e483;
  goto LAB_00d1e295;
}

Assistant:

static void tricore_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = ctx->uc;
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CPUTriCoreState *env = cpu->env_ptr;
    uint16_t insn_lo;
    bool is_16bit;
    uint32_t insn_size;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        ctx->base.is_jmp = DISAS_UC_EXIT;
    } else {
        insn_lo = cpu_lduw_code(env, ctx->base.pc_next);
        is_16bit = tricore_insn_is_16bit(insn_lo);

        insn_size = is_16bit ? 2 : 4;
        // Unicorn: trace this instruction on request
        if (HOOK_EXISTS_BOUNDED(ctx->uc, UC_HOOK_CODE, ctx->base.pc_next)) {
            // Sync PC in advance
            gen_save_pc(ctx, ctx->base.pc_next);

            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX, ctx->uc,
                             ctx->base.pc_next);
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }

        if (is_16bit) {
            ctx->opcode = insn_lo;
            ctx->pc_succ_insn = ctx->base.pc_next + 2;
            decode_16Bit_opc(ctx);
        } else {
            uint32_t insn_hi = cpu_lduw_code(env, ctx->base.pc_next + 2);
            ctx->opcode = insn_hi << 16 | insn_lo;
            ctx->pc_succ_insn = ctx->base.pc_next + 4;
            decode_32Bit_opc(ctx);
        }
        ctx->base.pc_next = ctx->pc_succ_insn;

        if (ctx->base.is_jmp == DISAS_NEXT) {
            target_ulong page_start;

            page_start = ctx->base.pc_first & TARGET_PAGE_MASK;
            if (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE
                || (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE - 3
                    && insn_crosses_page(env, ctx))) {
                ctx->base.is_jmp = DISAS_TOO_MANY;
            }
        }
    }
}